

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  SessionHandle *pSVar1;
  undefined4 *puVar2;
  CURLcode CVar3;
  long lVar4;
  size_t len;
  long lVar5;
  char *pcVar6;
  timeval tVar7;
  ssize_t bytes_written;
  size_t local_30;
  
  pSVar1 = conn->data;
  puVar2 = (undefined4 *)(pSVar1->req).protop;
  CVar3 = CURLE_OK;
  if ((puVar2 != (undefined4 *)0x0) && ((conn->proto).ftpc.pp.conn != (connectdata *)0x0)) {
    if (status == CURLE_OK) {
      CVar3 = CURLE_OK;
      if ((((pSVar1->set).connect_only == false) && ((pSVar1->set).upload == true)) &&
         (CVar3 = CURLE_OK, (pSVar1->set).mail_rcpt != (curl_slist *)0x0)) {
        if ((*(char *)(puVar2 + 8) == '\0') && ((pSVar1->state).infilesize != 0)) {
          len = 5;
          pcVar6 = "\r\n.\r\n";
        }
        else {
          len = 3;
          pcVar6 = ".\r\n";
        }
        CVar3 = Curl_write(conn,conn->writesockfd,pcVar6,len,(ssize_t *)&local_30);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        if (local_30 == len) {
          tVar7 = curlx_tvnow();
          lVar5 = tVar7.tv_usec;
          (conn->proto).ftpc.pp.response.tv_sec = tVar7.tv_sec;
          lVar4 = 0x520;
        }
        else {
          pcVar6 = (*Curl_cstrdup)(pcVar6);
          (conn->proto).ftpc.pp.sendthis = pcVar6;
          (conn->proto).ftpc.pp.sendsize = len;
          lVar5 = len - local_30;
          lVar4 = 0x508;
        }
        *(long *)((conn->chunk).hexbuffer + lVar4 + -8) = lVar5;
        (conn->proto).imapc.state = IMAP_APPEND;
        CVar3 = smtp_block_statemach(conn);
      }
    }
    else {
      (conn->bits).close = true;
      CVar3 = status;
    }
    if (*(void **)(puVar2 + 2) != (void *)0x0) {
      (*Curl_cfree)(*(void **)(puVar2 + 2));
      *(undefined8 *)(puVar2 + 2) = 0;
    }
    *puVar2 = 0;
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  struct pingpong *pp = &conn->proto.smtpc.pp;
  const char *eob;
  ssize_t len;
  ssize_t bytes_written;

  (void)premature;

  if(!smtp || !pp->conn)
    /* When the easy handle is removed from the multi interface while libcurl
       is still trying to resolve the host name, the SMTP struct is not yet
       initialized. However, the removal action calls Curl_done() which in
       turn calls this function, so we simply return success. */
    return CURLE_OK;

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.upload && data->set.mail_rcpt) {
    /* Calculate the EOB taking into account any terminating CRLF from the
       previous line of the email or the CRLF of the DATA command when there
       is "no mail data". RFC-5321, sect. 4.1.1.4. */
    eob = SMTP_EOB;
    len = SMTP_EOB_LEN;
    if(smtp->trailing_crlf || !conn->data->state.infilesize) {
      eob += 2;
      len -= 2;
    }

    /* Send the end of block data */
    result = Curl_write(conn, conn->writesockfd, eob, len, &bytes_written);
    if(result)
      return result;

    if(bytes_written != len) {
      /* The whole chunk was not sent so keep it around and adjust the
         pingpong structure accordingly */
      pp->sendthis = strdup(eob);
      pp->sendsize = len;
      pp->sendleft = len - bytes_written;
    }
    else
      /* Successfully sent so adjust the response timeout relative to now */
      pp->response = Curl_tvnow();

    state(conn, SMTP_POSTDATA);

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the smtp_multi_statemach function but we have no general support for
       non-blocking DONE operations, not in the multi state machine and with
       Curl_done() invokes on several places in the code!
    */
    result = smtp_block_statemach(conn);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  /* Clear the transfer mode for the next request */
  smtp->transfer = FTPTRANSFER_BODY;

  return result;
}